

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> * __thiscall
duckdb::ColumnList::GetColumnTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,ColumnList *this)

{
  pointer pCVar1;
  ColumnDefinition *column;
  pointer pCVar2;
  
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             ((long)(this->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
  pCVar1 = (this->columns).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->columns).
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&__return_storage_ptr__->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pCVar2->type);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalType> ColumnList::GetColumnTypes() const {
	vector<LogicalType> types;
	types.reserve(columns.size());
	for (auto &column : columns) {
		types.push_back(column.Type());
	}
	return types;
}